

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O1

type __thiscall
chrono::ChClassRegistration<myEmployee>::_create<myEmployee>(ChClassRegistration<myEmployee> *this)

{
  undefined8 *puVar1;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  puVar1 = (undefined8 *)operator_new(0x40);
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"John","");
  *puVar1 = &PTR__myEmployee_00158370;
  *(undefined4 *)(puVar1 + 1) = 0x12;
  puVar1[2] = 0x408fe26666666666;
  *(undefined4 *)(puVar1 + 3) = 0;
  puVar1[4] = puVar1 + 6;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar1 + 4),local_38,local_30 + (long)local_38);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return puVar1;
}

Assistant:

typename enable_if< std::is_default_constructible<Tc>::value, void* >::type
    _create() {
        return reinterpret_cast<void*>(new Tc);
    }